

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getclosureroot(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectValue *pSVar1;
  _HashNode *p_Var2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQObjectPtr local_18;
  
  if (idx < 0) {
    pSVar3 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar3 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  if ((pSVar3->super_SQObject)._type == OT_CLOSURE) {
    p_Var2 = ((pSVar3->super_SQObject)._unVal.pTable)->_firstfree;
    local_18.super_SQObject._type = (SQObjectType)(p_Var2->key).super_SQObject._unVal.fFloat;
    local_18.super_SQObject._unVal = (SQObjectValue)p_Var2->next;
    if ((local_18.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = (SQObjectValue *)
               &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      pSVar1->pTable =
           (SQTable *)
           ((long)&(pSVar1->pTable->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                   _vptr_SQRefCounted + 1);
    }
    SQVM::Push(v,&local_18);
    SQObjectPtr::~SQObjectPtr(&local_18);
    SVar4 = 0;
  }
  else {
    sq_throwerror(v,"closure expected");
    SVar4 = -1;
  }
  return SVar4;
}

Assistant:

SQRESULT sq_getclosureroot(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &c = stack_get(v,idx);
    if(!sq_isclosure(c)) return sq_throwerror(v, _SC("closure expected"));
    v->Push(_closure(c)->_root->_obj);
    return SQ_OK;
}